

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::shuffleV8x16
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,
          array<unsigned_char,_16UL> *mask)

{
  array<unsigned_char,_16UL> *paVar1;
  bool bVar2;
  size_type sVar3;
  byte *pbVar4;
  uint8_t local_71;
  ulong local_50;
  size_t i;
  uint8_t bytes [16];
  BasicType local_2c;
  array<unsigned_char,_16UL> *local_28;
  array<unsigned_char,_16UL> *mask_local;
  Literal *other_local;
  Literal *this_local;
  
  local_2c = v128;
  local_28 = mask;
  mask_local = (array<unsigned_char,_16UL> *)other;
  other_local = this;
  this_local = __return_storage_ptr__;
  bVar2 = wasm::Type::operator==(&this->type,&local_2c);
  if (!bVar2) {
    __assert_fail("type == Type::v128",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0x679,
                  "Literal wasm::Literal::shuffleV8x16(const Literal &, const std::array<uint8_t, 16> &) const"
                 );
  }
  local_50 = 0;
  while( true ) {
    sVar3 = std::array<unsigned_char,_16UL>::size(local_28);
    if (sVar3 <= local_50) break;
    pbVar4 = std::array<unsigned_char,_16UL>::operator[](local_28,local_50);
    paVar1 = mask_local;
    if (*pbVar4 < 0x10) {
      pbVar4 = std::array<unsigned_char,_16UL>::operator[](local_28,local_50);
      local_71 = (this->field_0).v128[*pbVar4];
    }
    else {
      pbVar4 = std::array<unsigned_char,_16UL>::operator[](local_28,local_50);
      local_71 = paVar1->_M_elems[(int)(*pbVar4 - 0x10)];
    }
    bytes[local_50 - 8] = local_71;
    local_50 = local_50 + 1;
  }
  Literal(__return_storage_ptr__,(uint8_t *)&i);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::shuffleV8x16(const Literal& other,
                              const std::array<uint8_t, 16>& mask) const {
  assert(type == Type::v128);
  uint8_t bytes[16];
  for (size_t i = 0; i < mask.size(); ++i) {
    bytes[i] = (mask[i] < 16) ? v128[mask[i]] : other.v128[mask[i] - 16];
  }
  return Literal(bytes);
}